

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
list_caster<std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_sdf_tools::real3>::
load(list_caster<std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_sdf_tools::real3>
     *this,handle src,bool convert)

{
  handle src_00;
  bool bVar1;
  undefined1 uVar2;
  PyObject *in_RDI;
  value_conv conv;
  reference it;
  sequence_iterator __end3;
  sequence_iterator __begin3;
  sequence *__range3;
  sequence s;
  It *in_stack_fffffffffffffed8;
  handle in_stack_fffffffffffffee0;
  handle in_stack_fffffffffffffee8;
  undefined5 in_stack_fffffffffffffef0;
  byte in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  byte local_1;
  
  bVar1 = isinstance<pybind11::sequence,_0>(in_stack_fffffffffffffee0);
  if (((!bVar1) || (bVar1 = isinstance<pybind11::bytes,_0>(in_stack_fffffffffffffee0), bVar1)) ||
     (bVar1 = isinstance<pybind11::str,_0>(in_stack_fffffffffffffee0), bVar1)) {
    local_1 = 0;
  }
  else {
    reinterpret_borrow<pybind11::sequence>(in_stack_fffffffffffffee8);
    std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>::clear
              ((vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_> *)0x17db47);
    sequence::sequence((sequence *)in_stack_fffffffffffffee0.m_ptr,
                       (sequence *)in_stack_fffffffffffffed8);
    reserve_maybe<std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_0>
              ((list_caster<std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_sdf_tools::real3>
                *)CONCAT17(in_stack_fffffffffffffef7,
                           CONCAT16(in_stack_fffffffffffffef6,
                                    CONCAT15(in_stack_fffffffffffffef5,in_stack_fffffffffffffef0))),
               (sequence *)in_stack_fffffffffffffee8.m_ptr,
               (vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_> *)
               in_stack_fffffffffffffee0.m_ptr);
    sequence::~sequence((sequence *)0x17db7f);
    sequence::begin((sequence *)in_stack_fffffffffffffee0.m_ptr);
    sequence::end((sequence *)in_stack_fffffffffffffee0.m_ptr);
    while (uVar2 = detail::operator!=((It *)in_stack_fffffffffffffee0.m_ptr,
                                      in_stack_fffffffffffffed8), (bool)uVar2) {
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator*
                (in_stack_fffffffffffffed8);
      type_caster<sdf_tools::real3,_void>::type_caster
                ((type_caster<sdf_tools::real3,_void> *)0x17dc3e);
      accessor::operator_cast_to_object
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)
                 in_stack_fffffffffffffee8.m_ptr);
      src_00.m_ptr._5_1_ = in_stack_fffffffffffffef5;
      src_00.m_ptr._0_5_ = in_stack_fffffffffffffef0;
      src_00.m_ptr._6_1_ = in_stack_fffffffffffffef6;
      src_00.m_ptr._7_1_ = uVar2;
      in_stack_fffffffffffffef6 =
           type_caster_generic::load
                     ((type_caster_generic *)in_stack_fffffffffffffee8.m_ptr,src_00,
                      SUB81((ulong)in_stack_fffffffffffffee0.m_ptr >> 0x38,0));
      in_stack_fffffffffffffef5 = in_stack_fffffffffffffef6 ^ 0xff;
      object::~object((object *)0x17dc92);
      bVar1 = (in_stack_fffffffffffffef5 & 1) != 0;
      if (bVar1) {
        local_1 = 0;
      }
      else {
        in_stack_fffffffffffffee0.m_ptr = in_RDI;
        in_stack_fffffffffffffee8.m_ptr =
             (PyObject *)cast_op<sdf_tools::real3&&>((make_caster<sdf_tools::real3_&&> *)0x17dd40);
        std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>::push_back
                  ((vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_> *)
                   CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffef6,
                                           CONCAT15(in_stack_fffffffffffffef5,
                                                    in_stack_fffffffffffffef0))),
                   (value_type *)in_stack_fffffffffffffee8.m_ptr);
      }
      accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)0x17dd6d);
      if (bVar1) goto LAB_0017ddac;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 in_stack_fffffffffffffee0.m_ptr);
    }
    local_1 = 1;
LAB_0017ddac:
    sequence::~sequence((sequence *)0x17ddb9);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<bytes>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }